

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O1

void __thiscall
google::protobuf::Reflection::VerifyFieldType<google::protobuf::Message_const*>
          (Reflection *this,FieldDescriptor *field)

{
  byte bVar1;
  int iVar2;
  Nonnull<const_char_*> pcVar3;
  bool bVar4;
  size_type in_R9;
  UntypedFormatSpecImpl format;
  UntypedFormatSpecImpl format_00;
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args;
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args_00;
  LogMessage LStack_78;
  string local_68;
  undefined8 local_48;
  char *local_40;
  ulong local_38;
  char *local_30;
  ulong *local_28;
  code *local_20;
  undefined8 *local_18;
  code *local_10;
  
  bVar1 = field->field_0x1;
  bVar4 = (bool)((bVar1 & 0x20) >> 5);
  if (0xbf < bVar1 == bVar4) {
    pcVar3 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                       (bVar4,0xbf < bVar1,
                        "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
  }
  if (pcVar3 == (Nonnull<const_char_*>)0x0) {
    if ((field->field_0x1 & 0x20) == 0) {
      pcVar3 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                         (true,false,"field->is_repeated() == internal::IsRepeatedT<T>");
    }
    if (pcVar3 == (Nonnull<const_char_*>)0x0) {
      iVar2 = 1;
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 8) {
        iVar2 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4);
      }
      if (iVar2 == 10) {
        pcVar3 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                           ((long)iVar2,10,"+cpp_type == +internal::GetCppType<T>()");
      }
      if (pcVar3 == (Nonnull<const_char_*>)0x0) {
        bVar1 = field->field_0x1;
        bVar4 = (bool)((bVar1 & 0x20) >> 5);
        if (0xbf < bVar1 == bVar4) {
          pcVar3 = (Nonnull<const_char_*>)0x0;
        }
        else {
          pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                             (bVar4,0xbf < bVar1,
                              "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
        }
        if (pcVar3 == (Nonnull<const_char_*>)0x0) {
          return;
        }
        goto LAB_00fae050;
      }
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&LStack_78,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message.h"
                 ,0x6bf,pcVar3);
      local_30 = (field->all_names_).payload_;
      local_38 = (ulong)*(ushort *)(local_30 + 2);
      local_28 = &local_38;
      local_30 = local_30 + ~local_38;
      local_18 = &local_48;
      local_48 = 0x1c;
      local_40 = "PKN6google8protobuf7MessageE";
      local_20 = absl::lts_20250127::str_format_internal::FormatArgImpl::
                 Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
      local_10 = absl::lts_20250127::str_format_internal::FormatArgImpl::
                 Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
      format_00.size_ = (size_t)&local_28;
      format_00.data_ = &DAT_0000001e;
      args_00.len_ = in_R9;
      args_00.ptr_ = (pointer)0x2;
      absl::lts_20250127::str_format_internal::FormatPack_abi_cxx11_
                (&local_68,(str_format_internal *)"Invalid cast of %s to type %s.",format_00,args_00
                );
      absl::lts_20250127::log_internal::LogMessage::operator<<(&LStack_78,&local_68);
    }
    else {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&LStack_78,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message.h"
                 ,0x6b3,pcVar3);
      local_30 = (field->all_names_).payload_;
      local_38 = (ulong)*(ushort *)(local_30 + 2);
      local_28 = &local_38;
      local_30 = local_30 + ~local_38;
      local_18 = &local_48;
      local_48 = 0x1c;
      local_40 = "PKN6google8protobuf7MessageE";
      local_20 = absl::lts_20250127::str_format_internal::FormatArgImpl::
                 Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
      local_10 = absl::lts_20250127::str_format_internal::FormatArgImpl::
                 Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
      format.size_ = (size_t)&local_28;
      format.data_ = &DAT_0000001e;
      args.len_ = in_R9;
      args.ptr_ = (pointer)0x2;
      absl::lts_20250127::str_format_internal::FormatPack_abi_cxx11_
                (&local_68,(str_format_internal *)"Invalid cast of %s to type %s.",format,args);
      absl::lts_20250127::log_internal::LogMessage::operator<<(&LStack_78,&local_68);
    }
    std::__cxx11::string::~string((string *)&local_68);
  }
  else {
    VerifyFieldType<google::protobuf::Message_const*>();
LAB_00fae050:
    VerifyFieldType<google::protobuf::Message_const*>();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_78)
  ;
}

Assistant:

void Reflection::VerifyFieldType(const FieldDescriptor* field) const {
  if constexpr (!internal::PerformDebugChecks()) {
    return;
  }
  if constexpr (std::is_const_v<T>) {
    return VerifyFieldType<std::remove_const_t<T>>(field);
  }

  // `char` and `void` are used in places where we don't know the type yet.
  if constexpr (std::is_same_v<T, char> || std::is_same_v<T, void>) {
    return;
  }

  const auto error = [&] {
    return absl::StrFormat("Invalid cast of %s to type %s.", field->full_name(),
                           internal::RttiTypeName<T>().value_or("unknown"));
  };

  ABSL_DCHECK_EQ(field->is_repeated(), internal::IsRepeatedT<T>) << error();
  if constexpr (std::is_same_v<T, internal::MapFieldBase>) {
    ABSL_DCHECK(field->is_map()) << error();
  } else if constexpr (std::is_same_v<T, internal::RepeatedPtrFieldBase>) {
    // It has to be string or message.
    ABSL_DCHECK(field->cpp_type() == field->CPPTYPE_STRING ||
                field->cpp_type() == field->CPPTYPE_MESSAGE)
        << error();
  } else {
    auto cpp_type = field->cpp_type();
    // Collapse ENUM to INT32 because they are the same through reflection.
    if (cpp_type == field->CPPTYPE_ENUM) cpp_type = field->CPPTYPE_INT32;
    ABSL_DCHECK_EQ(+cpp_type, +internal::GetCppType<T>()) << error();

    // Check subfield types for message.
    if constexpr (internal::GetCppType<T>() ==
                  FieldDescriptor::CPPTYPE_MESSAGE) {
      // Singular/oneof messages are by pointer, except non-oneof Lazy.
      if (!field->is_repeated() &&
          (!IsLazyField(field) || field->real_containing_oneof() != nullptr)) {
        ABSL_DCHECK(std::is_pointer_v<T>) << error();
      }
    }

    // Check subfield types for string.
    if constexpr (internal::GetCppType<T>() ==
                  FieldDescriptor::CPPTYPE_STRING) {
      switch (field->cpp_string_type()) {
        case FieldDescriptor::CppStringType::kView:
        case FieldDescriptor::CppStringType::kString:
          if (IsMicroString(field)) {
            ABSL_DCHECK((std::is_same_v<T, internal::MicroString>)) << error();
          } else {
            ABSL_DCHECK((std::is_same_v<T, internal::ArenaStringPtr> ||
                         std::is_same_v<T, RepeatedPtrField<std::string>>))
                << error();
          }
          break;
        case FieldDescriptor::CppStringType::kCord:
          if (field->real_containing_oneof() != nullptr) {
            ABSL_DCHECK((std::is_same_v<T, absl::Cord*>)) << error();
          } else {
            ABSL_DCHECK((std::is_same_v<T, absl::Cord> ||
                         std::is_same_v<T, RepeatedField<absl::Cord>>))
                << error();
          }
          break;
      }
    }
  }
}